

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

StringResult<long_long> __thiscall
QCborStreamReaderPrivate::readStringChunk(QCborStreamReaderPrivate *this,ReadStringChunk params)

{
  ReadStringChunk params_00;
  ReadStringChunk params_01;
  bool bVar1;
  qsizetype qVar2;
  char *__dest;
  __off_t __length;
  __off_t __length_00;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 in_RSI;
  QCborStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  StringResult<long_long> SVar3;
  QCborStreamReaderPrivate *in_stack_00000010;
  ReadStringChunk in_stack_00000018;
  char *ptr;
  qsizetype remainingInBuffer;
  qptrdiff offset;
  CborError err;
  qsizetype in_stack_00000070;
  void *content;
  size_t len;
  StringResult<long_long> result;
  undefined4 in_stack_ffffffffffffff48;
  CborError in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QCborStreamReaderPrivate *in_stack_ffffffffffffff58;
  QCborStreamReaderPrivate *in_stack_ffffffffffffff70;
  CborError local_7c;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 in_stack_ffffffffffffffb0;
  QCborStreamReaderPrivate *in_stack_ffffffffffffffb8;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 aVar4;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar4.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCborStreamReader::StringResult<long_long>::StringResult((StringResult<long_long> *)local_18);
  local_18._0_8_ = 0;
  local_18._8_4_ = Error;
  (in_RDI->lastError).c = NoError;
  bVar1 = ensureStringIteration(in_stack_ffffffffffffff58);
  if (bVar1) {
    local_7c = _cbor_value_get_string_chunk
                         ((CborValue *)in_RDI,&in_stack_ffffffffffffff58->device,
                          (size_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (CborValue *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                         );
    if ((local_7c == CborNoError) && ((long)aVar4.ptr < 0)) {
      local_7c = CborErrorDataTooLarge;
    }
    if (local_7c == CborNoError) {
      in_RDI->bufferStart = in_RDI->bufferStart;
      if ((CborParser *)in_RDI->device != (CborParser *)0x0) {
        QIODevice::skip((QIODevice *)in_stack_ffffffffffffffb0.array,(qint64)in_RSI);
      }
      bVar1 = ReadStringChunk::isString((ReadStringChunk *)&stack0xffffffffffffffd8);
      if (bVar1) {
        local_18._0_8_ =
             readStringChunk_unicode(in_stack_00000010,in_stack_00000018,in_stack_00000070);
      }
      else {
        bVar1 = ReadStringChunk::isUtf8String((ReadStringChunk *)&stack0xffffffffffffffd8);
        if (bVar1) {
          params_00.maxlen_or_type = (qsizetype)in_stack_ffffffffffffffb8;
          params_00.field_0.ptr = in_stack_ffffffffffffffb0.ptr;
          local_18._0_8_ =
               readStringChunk_utf8(in_RDI,params_00,(qsizetype)in_stack_ffffffffffffff58);
        }
        else {
          params_01.maxlen_or_type = (qsizetype)in_RSI.ptr;
          params_01.field_0.ptr = aVar4.ptr;
          local_18._0_8_ =
               readStringChunk_byte
                         (in_stack_ffffffffffffffb8,params_01,(qsizetype)in_stack_ffffffffffffffb0);
        }
      }
      if (-1 < (long)local_18._0_8_) {
        in_RDI->bufferStart = (size_type)(aVar4.ptr + in_RDI->bufferStart);
        if ((CborParser *)in_RDI->device != (CborParser *)0x0) {
          qVar2 = QByteArray::size((QByteArray *)&in_RDI->buffer);
          in_stack_ffffffffffffff70 = (QCborStreamReaderPrivate *)(qVar2 - in_RDI->bufferStart);
          if ((long)in_stack_ffffffffffffff70 < 1) {
            QByteArray::truncate((QByteArray *)&in_RDI->buffer,(char *)0x0,__length);
          }
          else {
            __dest = QByteArray::data((QByteArray *)
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
            ;
            memmove(__dest,__dest + in_RDI->bufferStart,(size_t)in_stack_ffffffffffffff70);
            QByteArray::truncate
                      ((QByteArray *)&in_RDI->buffer,(char *)in_stack_ffffffffffffff70,__length_00);
          }
          in_RDI->bufferStart = 0;
        }
        preread(in_stack_ffffffffffffff70);
        local_18._8_4_ = Ok;
      }
    }
    else {
      if (local_7c == CborErrorNoMoreStringChunks) {
        preread(in_stack_ffffffffffffff70);
        local_7c = cbor_value_finish_string_iteration((CborValue *)0x8d7341);
        local_18._8_4_ = EndOfString;
      }
      if (local_7c != CborNoError) {
        handleError((QCborStreamReaderPrivate *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  SVar3.status = local_18._8_4_;
  SVar3.data = local_18._0_8_;
  SVar3._12_4_ = 0;
  return SVar3;
}

Assistant:

Q_NEVER_INLINE QCborStreamReader::StringResult<qsizetype>
QCborStreamReaderPrivate::readStringChunk(ReadStringChunk params)
{
    CborError err;
    size_t len;
    const void *content = nullptr;
    QCborStreamReader::StringResult<qsizetype> result;
    result.data = 0;
    result.status = QCborStreamReader::Error;

    lastError = {};
    if (!ensureStringIteration())
        return result;

    // Note: in the current implementation, the call into TinyCBOR below only
    // succeeds if we *already* have all the data in memory. That's obvious for
    // the case of direct memory (no QIODevice), whereas for QIODevices
    // qt_cbor_decoder_transfer_string() enforces that
    // QIODevice::bytesAvailable() be bigger than the amount we're about to
    // read.
    //
    // This is an important security gate: if the CBOR stream is corrupt or
    // malicious, and has an impossibly large string size, we only go past it
    // if the transfer to the destination buffer will succeed (modulo QIODevice
    // I/O failures).

#if 1
    // Using internal TinyCBOR API!
    err = _cbor_value_get_string_chunk(&currentElement, &content, &len, &currentElement);
#else
    // the above is effectively the same as:
    if (cbor_value_is_byte_string(&currentElement))
        err = cbor_value_get_byte_string_chunk(&currentElement, reinterpret_cast<const uint8_t **>(&content),
                                               &len, &currentElement);
    else
        err = cbor_value_get_text_string_chunk(&currentElement, reinterpret_cast<const char **>(&content),
                                               &len, &currentElement);
#endif

    // Range check: using implementation-defined behavior in converting an
    // unsigned value out of range of the destination signed type (same as
    // "len > size_t(std::numeric_limits<qsizetype>::max())", but generates
    // better code with ICC and MSVC).
    if (!err && qsizetype(len) < 0)
        err = CborErrorDataTooLarge;

    if (err) {
        if (err == CborErrorNoMoreStringChunks) {
            preread();
            err = cbor_value_finish_string_iteration(&currentElement);
            result.status = QCborStreamReader::EndOfString;
        }
        if (err)
            handleError(err);
        // caller musts call preparse()
        return result;
    }

    qptrdiff offset = qptrdiff(content);
    bufferStart += offset;
    if (device) {
        // This first skip can't fail because we've already read this many bytes.
        device->skip(bufferStart);
    }

    if (params.isString()) {
        // readString()
        result.data = readStringChunk_unicode(params, qsizetype(len));
    } else if (params.isUtf8String()) {
        result.data = readStringChunk_utf8(params, qsizetype(len));
    } else {
        // readByteArray() or readStringChunk()
        result.data = readStringChunk_byte(params, qsizetype(len));
    }

    if (result.data < 0)
        return result;      // error

    // adjust the buffers after we're done reading the string
    bufferStart += len;
    if (device) {
        qsizetype remainingInBuffer = buffer.size() - bufferStart;

        if (remainingInBuffer <= 0) {
            // We've read from the QIODevice more than what was in the buffer.
            buffer.truncate(0);
        } else {
            // There's still data buffered, but we need to move it around.
            char *ptr = buffer.data();
            memmove(ptr, ptr + bufferStart, remainingInBuffer);
            buffer.truncate(remainingInBuffer);
        }

        bufferStart = 0;
    }

    preread();
    result.status = QCborStreamReader::Ok;
    return result;
}